

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O3

void Scl_LibPinArrival(SC_Timing *pTime,SC_Pair *pArrIn,SC_Pair *pSlewIn,SC_Pair *pLoad,
                      SC_Pair *pArrOut,SC_Pair *pSlewOut)

{
  SC_TSense SVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  SVar1 = pTime->tsense;
  if ((SVar1 | sc_ts_Neg) == sc_ts_Non) {
    fVar4 = pArrOut->rise;
    fVar3 = pArrIn->rise;
    fVar2 = Scl_LibLookup(&pTime->pCellRise,pSlewIn->rise,pLoad->rise);
    fVar2 = fVar2 + fVar3;
    if (fVar4 <= fVar2) {
      fVar4 = fVar2;
    }
    pArrOut->rise = fVar4;
    fVar4 = pArrOut->fall;
    fVar3 = pArrIn->fall;
    fVar2 = Scl_LibLookup(&pTime->pCellFall,pSlewIn->fall,pLoad->fall);
    fVar2 = fVar2 + fVar3;
    if (fVar4 <= fVar2) {
      fVar4 = fVar2;
    }
    pArrOut->fall = fVar4;
    fVar4 = pSlewOut->rise;
    fVar3 = Scl_LibLookup(&pTime->pRiseTrans,pSlewIn->rise,pLoad->rise);
    if (fVar4 <= fVar3) {
      fVar4 = fVar3;
    }
    pSlewOut->rise = fVar4;
    fVar4 = pSlewOut->fall;
    fVar3 = Scl_LibLookup(&pTime->pFallTrans,pSlewIn->fall,pLoad->fall);
    if (fVar4 <= fVar3) {
      fVar4 = fVar3;
    }
    pSlewOut->fall = fVar4;
    SVar1 = pTime->tsense;
  }
  if ((SVar1 & ~sc_ts_Pos) == sc_ts_Neg) {
    fVar4 = pArrOut->rise;
    fVar3 = pArrIn->fall;
    fVar2 = Scl_LibLookup(&pTime->pCellRise,pSlewIn->fall,pLoad->rise);
    fVar2 = fVar2 + fVar3;
    if (fVar4 <= fVar2) {
      fVar4 = fVar2;
    }
    pArrOut->rise = fVar4;
    fVar4 = pArrOut->fall;
    fVar3 = pArrIn->rise;
    fVar2 = Scl_LibLookup(&pTime->pCellFall,pSlewIn->rise,pLoad->fall);
    fVar2 = fVar2 + fVar3;
    if (fVar4 <= fVar2) {
      fVar4 = fVar2;
    }
    pArrOut->fall = fVar4;
    fVar4 = pSlewOut->rise;
    fVar3 = Scl_LibLookup(&pTime->pRiseTrans,pSlewIn->fall,pLoad->rise);
    if (fVar4 <= fVar3) {
      fVar4 = fVar3;
    }
    pSlewOut->rise = fVar4;
    fVar4 = pSlewOut->fall;
    fVar3 = Scl_LibLookup(&pTime->pFallTrans,pSlewIn->rise,pLoad->fall);
    if (fVar4 <= fVar3) {
      fVar4 = fVar3;
    }
    pSlewOut->fall = fVar4;
  }
  return;
}

Assistant:

static inline void Scl_LibPinArrival( SC_Timing * pTime, SC_Pair * pArrIn, SC_Pair * pSlewIn, SC_Pair * pLoad, SC_Pair * pArrOut, SC_Pair * pSlewOut )
{
    if (pTime->tsense == sc_ts_Pos || pTime->tsense == sc_ts_Non)
    {
        pArrOut->rise  = Abc_MaxFloat( pArrOut->rise,  pArrIn->rise + Scl_LibLookup(&pTime->pCellRise,  pSlewIn->rise, pLoad->rise) );
        pArrOut->fall  = Abc_MaxFloat( pArrOut->fall,  pArrIn->fall + Scl_LibLookup(&pTime->pCellFall,  pSlewIn->fall, pLoad->fall) );
        pSlewOut->rise = Abc_MaxFloat( pSlewOut->rise,                Scl_LibLookup(&pTime->pRiseTrans, pSlewIn->rise, pLoad->rise) );
        pSlewOut->fall = Abc_MaxFloat( pSlewOut->fall,                Scl_LibLookup(&pTime->pFallTrans, pSlewIn->fall, pLoad->fall) );
    }
    if (pTime->tsense == sc_ts_Neg || pTime->tsense == sc_ts_Non)
    {
        pArrOut->rise  = Abc_MaxFloat( pArrOut->rise,  pArrIn->fall + Scl_LibLookup(&pTime->pCellRise,  pSlewIn->fall, pLoad->rise) );
        pArrOut->fall  = Abc_MaxFloat( pArrOut->fall,  pArrIn->rise + Scl_LibLookup(&pTime->pCellFall,  pSlewIn->rise, pLoad->fall) );
        pSlewOut->rise = Abc_MaxFloat( pSlewOut->rise,                Scl_LibLookup(&pTime->pRiseTrans, pSlewIn->fall, pLoad->rise) );
        pSlewOut->fall = Abc_MaxFloat( pSlewOut->fall,                Scl_LibLookup(&pTime->pFallTrans, pSlewIn->rise, pLoad->fall) );
    }
}